

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

bool google::protobuf::internal::WireFormat::ParseAndMergeMessageSetField
               (uint32 field_number,FieldDescriptor *field,Message *message,CodedInputStream *input)

{
  bool bVar1;
  Type TVar2;
  Reflection *value;
  CodedInputStream *in_RCX;
  CodedInputStream *in_RDX;
  long in_RSI;
  Message *sub_message;
  Reflection *message_reflection;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  Reflection *in_stack_ffffffffffffff50;
  UnknownFieldSet *in_stack_ffffffffffffff58;
  LogLevel_conflict level;
  LogMessage *in_stack_ffffffffffffff60;
  CodedInputStream *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  FieldDescriptor *in_stack_ffffffffffffff88;
  Message *in_stack_ffffffffffffff90;
  Reflection *in_stack_ffffffffffffff98;
  bool local_1;
  
  value = Message::GetReflection((Message *)in_stack_ffffffffffffff50);
  if (in_RSI == 0) {
    Reflection::MutableUnknownFields
              (in_stack_ffffffffffffff50,
               (Message *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    local_1 = SkipMessageSetField(in_stack_ffffffffffffff68,
                                  (uint32)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                                  in_stack_ffffffffffffff58);
  }
  else {
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x47088f);
    level = (LogLevel_conflict)((ulong)in_stack_ffffffffffffff58 >> 0x20);
    if ((!bVar1) &&
       (TVar2 = FieldDescriptor::type((FieldDescriptor *)in_stack_ffffffffffffff60),
       TVar2 == TYPE_MESSAGE)) {
      io::CodedInputStream::GetExtensionFactory(in_RCX);
      Reflection::MutableMessage
                (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                 (MessageFactory *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      bVar1 = WireFormatLite::ReadMessage<google::protobuf::Message>(in_RDX,(Message *)value);
      return bVar1;
    }
    LogMessage::LogMessage
              (in_stack_ffffffffffffff60,level,(char *)in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff4c);
    LogMessage::operator<<
              ((LogMessage *)in_stack_ffffffffffffff50,
               (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    LogFinisher::operator=
              ((LogFinisher *)in_stack_ffffffffffffff50,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    LogMessage::~LogMessage((LogMessage *)0x4708f8);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool WireFormat::ParseAndMergeMessageSetField(uint32 field_number,
                                              const FieldDescriptor* field,
                                              Message* message,
                                              io::CodedInputStream* input) {
  const Reflection* message_reflection = message->GetReflection();
  if (field == NULL) {
    // We store unknown MessageSet extensions as groups.
    return SkipMessageSetField(
        input, field_number, message_reflection->MutableUnknownFields(message));
  } else if (field->is_repeated() ||
             field->type() != FieldDescriptor::TYPE_MESSAGE) {
    // This shouldn't happen as we only allow optional message extensions to
    // MessageSet.
    GOOGLE_LOG(ERROR) << "Extensions of MessageSets must be optional messages.";
    return false;
  } else {
    Message* sub_message = message_reflection->MutableMessage(
        message, field, input->GetExtensionFactory());
    return WireFormatLite::ReadMessage(input, sub_message);
  }
}